

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser * init_parse_trap(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name sym name str desc",parse_trap_name);
  parser_reg(p,"graphics char glyph sym color",parse_trap_graphics);
  parser_reg(p,"appear uint rarity uint mindepth uint maxnum",parse_trap_appear);
  parser_reg(p,"visibility str visibility",parse_trap_visibility);
  parser_reg(p,"flags ?str flags",parse_trap_flags);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_trap_effect);
  parser_reg(p,"effect-yx int y int x",parse_trap_effect_yx);
  parser_reg(p,"dice str dice",parse_trap_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_trap_expr);
  parser_reg(p,"effect-xtra sym eff ?sym type ?int radius ?int other",parse_trap_effect_xtra);
  parser_reg(p,"effect-yx-xtra int y int x",parse_trap_effect_yx_xtra);
  parser_reg(p,"dice-xtra str dice",parse_trap_dice_xtra);
  parser_reg(p,"expr-xtra sym name sym base str expr",parse_trap_expr_xtra);
  parser_reg(p,"save str flags",parse_trap_save_flags);
  parser_reg(p,"desc str text",parse_trap_desc);
  parser_reg(p,"msg str text",parse_trap_msg);
  parser_reg(p,"msg-good str text",parse_trap_msg_good);
  parser_reg(p,"msg-bad str text",parse_trap_msg_bad);
  parser_reg(p,"msg-xtra str text",parse_trap_msg_xtra);
  return p;
}

Assistant:

static struct parser *init_parse_trap(void) {
    struct parser *p = parser_new();
    parser_setpriv(p, NULL);
    parser_reg(p, "name sym name str desc", parse_trap_name);
    parser_reg(p, "graphics char glyph sym color", parse_trap_graphics);
    parser_reg(p, "appear uint rarity uint mindepth uint maxnum", parse_trap_appear);
    parser_reg(p, "visibility str visibility", parse_trap_visibility);
    parser_reg(p, "flags ?str flags", parse_trap_flags);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_trap_effect);
	parser_reg(p, "effect-yx int y int x", parse_trap_effect_yx);
	parser_reg(p, "dice str dice", parse_trap_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_trap_expr);
	parser_reg(p, "effect-xtra sym eff ?sym type ?int radius ?int other", parse_trap_effect_xtra);
	parser_reg(p, "effect-yx-xtra int y int x", parse_trap_effect_yx_xtra);
	parser_reg(p, "dice-xtra str dice", parse_trap_dice_xtra);
	parser_reg(p, "expr-xtra sym name sym base str expr", parse_trap_expr_xtra);
	parser_reg(p, "save str flags", parse_trap_save_flags);
	parser_reg(p, "desc str text", parse_trap_desc);
	parser_reg(p, "msg str text", parse_trap_msg);
	parser_reg(p, "msg-good str text", parse_trap_msg_good);
	parser_reg(p, "msg-bad str text", parse_trap_msg_bad);
	parser_reg(p, "msg-xtra str text", parse_trap_msg_xtra);
    return p;
}